

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBar::actionEvent(ToolBar *this,QActionEvent *event)

{
  Type TVar1;
  int iVar2;
  QAction *action_00;
  ToolButton *this_00;
  ToolBarPrivate *pTVar3;
  long *plVar4;
  int index;
  ToolButton *b;
  QAction *action;
  QActionEvent *event_local;
  ToolBar *this_local;
  
  action_00 = QActionEvent::action(event);
  TVar1 = QEvent::type((QEvent *)event);
  if (TVar1 == ActionChanged) {
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    (**(code **)(*(long *)pTVar3->layout + 0x70))();
  }
  else if (TVar1 == ActionAdded) {
    this_00 = (ToolButton *)operator_new(0x30);
    ToolButton::ToolButton(this_00,action_00,&this->super_QWidget);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    ToolButton::setIconSize(this_00,&pTVar3->iconSize);
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    ToolBarLayout::addButton(pTVar3->layout,this_00);
    QWidget::show();
  }
  else if (TVar1 == ActionRemoved) {
    pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
             ::operator->(&this->d);
    iVar2 = ToolBarLayout::indexOf(pTVar3->layout,action_00);
    if (iVar2 != -1) {
      pTVar3 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
               ::operator->(&this->d);
      plVar4 = (long *)(**(code **)(*(long *)pTVar3->layout + 0xb0))(pTVar3->layout,iVar2);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
  }
  return;
}

Assistant:

void
ToolBar::actionEvent( QActionEvent * event )
{
	QAction * action = event->action();

	switch( event->type() )
	{
		case QEvent::ActionAdded :
		{
			ToolButton * b = new ToolButton( action, this );
			b->setIconSize( d->iconSize );
			d->layout->addButton( b );
			b->show();
		}
			break;

		case QEvent::ActionChanged :
			d->layout->invalidate();
			break;

		case QEvent::ActionRemoved :
		{
			int index = d->layout->indexOf( action );
			if( index != -1 )
				delete d->layout->takeAt( index );
		}
			break;

		default :
			break;
	}
}